

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_suite.cpp
# Opt level: O0

void value_find_suite::run(void)

{
  find_null();
  find_boolean();
  find_const_boolean();
  find_integer();
  find_const_integer();
  find_real();
  find_const_real();
  find_string();
  find_const_string();
  find_wstring();
  find_const_wstring();
  find_u16string();
  find_const_u16string();
  find_u32string();
  find_const_u32string();
  find_array();
  find_const_array();
  find_array_with_array();
  find_array_with_map();
  find_map();
  find_const_map();
  find_map_with_array();
  find_map_with_map();
  return;
}

Assistant:

void run()
{
    find_null();
    find_boolean();
    find_const_boolean();
    find_integer();
    find_const_integer();
    find_real();
    find_const_real();
    find_string();
    find_const_string();
    find_wstring();
    find_const_wstring();
    find_u16string();
    find_const_u16string();
    find_u32string();
    find_const_u32string();
    find_array();
    find_const_array();
    find_array_with_array();
    find_array_with_map();
    find_map();
    find_const_map();
    find_map_with_array();
    find_map_with_map();
}